

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

text_input_buffer * __thiscall dtc::text_input_buffer::next_token(text_input_buffer *this)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  element_type *peVar1;
  bool bVar2;
  _Elt_pointer psVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  int iVar6;
  int iVar7;
  _Elt_pointer psVar8;
  uint uVar9;
  
  this_00 = &this->input_stack;
  iVar6 = this->cursor;
  do {
    skip_spaces(this);
    bVar2 = finished(this);
    if (bVar2) {
      return this;
    }
    psVar5 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar4 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 != psVar5) {
      psVar3 = (this->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      psVar8 = psVar4;
      if (psVar4 == psVar3) {
        psVar8 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar7 = peVar1->cursor;
      if (((-1 < (long)iVar7) && (iVar7 < peVar1->size)) && (peVar1->buffer[iVar7] == '/')) {
        psVar8 = psVar4;
        if (psVar4 == psVar3) {
          psVar8 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (((-2 < peVar1->cursor) && (uVar9 = peVar1->cursor + 1, (int)uVar9 < peVar1->size)) &&
           (peVar1->buffer[uVar9] == '*')) {
          this->cursor = this->cursor + 1;
          psVar8 = psVar4;
          if (psVar4 == psVar3) {
            psVar8 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = peVar1->cursor + 1;
          peVar1->cursor = iVar7;
          if (peVar1->size <= iVar7) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
            psVar5 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          if (psVar4 != psVar5) {
            this->cursor = this->cursor + 1;
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar1->cursor + 1;
            peVar1->cursor = iVar7;
            if (peVar1->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          do {
            psVar5 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar4 == psVar5) goto LAB_00133d83;
            do {
              psVar3 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first;
              psVar8 = psVar4;
              if (psVar4 == psVar3) {
                psVar8 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar1->cursor;
              if ((((long)iVar7 < 0) || (peVar1->size <= iVar7)) || (peVar1->buffer[iVar7] == '\0'))
              break;
              psVar8 = psVar4;
              if (psVar4 == psVar3) {
                psVar8 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar1->cursor;
              if (((-1 < (long)iVar7) && (iVar7 < peVar1->size)) && (peVar1->buffer[iVar7] == '*'))
              break;
              bVar2 = finished(this);
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (bVar2) break;
              if (psVar4 == psVar5) goto LAB_00133d83;
              this->cursor = this->cursor + 1;
              psVar3 = psVar4;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar3 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar1->cursor + 1;
              peVar1->cursor = iVar7;
              if (peVar1->size <= iVar7) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
                psVar5 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              }
            } while (psVar4 != psVar5);
            if (psVar4 != psVar5) {
              this->cursor = this->cursor + 1;
              psVar3 = psVar4;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar3 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar1->cursor + 1;
              peVar1->cursor = iVar7;
              if (peVar1->size <= iVar7) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
                psVar5 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              }
            }
            if (psVar4 == psVar5) goto LAB_00133bb7;
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
            psVar8 = psVar4;
            if (psVar4 == psVar3) {
              psVar8 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar1->cursor;
            if ((((long)iVar7 < 0) || (peVar1->size <= iVar7)) || (peVar1->buffer[iVar7] == '\0'))
            goto LAB_00133bb7;
            psVar8 = psVar4;
            if (psVar4 == psVar3) {
              psVar8 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar1->cursor;
            if (((-1 < (long)iVar7) && (iVar7 < peVar1->size)) && (peVar1->buffer[iVar7] == '/'))
            goto LAB_00133bb7;
            bVar2 = finished(this);
          } while (!bVar2);
          psVar5 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_00133bb7:
          if (psVar4 != psVar5) {
            this->cursor = this->cursor + 1;
            psVar3 = psVar4;
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar3 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar1->cursor + 1;
            peVar1->cursor = iVar7;
            if (peVar1->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            }
          }
        }
      }
      if (psVar4 != psVar5) {
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar8 = psVar4;
        if (psVar4 == psVar3) {
          psVar8 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar7 = peVar1->cursor;
        if (((-1 < (long)iVar7) && (iVar7 < peVar1->size)) && (peVar1->buffer[iVar7] == '/')) {
          psVar8 = psVar4;
          if (psVar4 == psVar3) {
            psVar8 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (((-2 < peVar1->cursor) && (uVar9 = peVar1->cursor + 1, (int)uVar9 < peVar1->size)) &&
             (peVar1->buffer[uVar9] == '/')) {
            this->cursor = this->cursor + 1;
            psVar8 = psVar4;
            if (psVar4 == psVar3) {
              psVar8 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar1->cursor + 1;
            peVar1->cursor = iVar7;
            if (peVar1->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            }
            do {
              if (psVar4 != psVar5) {
                this->cursor = this->cursor + 1;
                if (psVar4 == (this->input_stack).c.
                              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  psVar4 = (this->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar1 = psVar4[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar7 = peVar1->cursor + 1;
                peVar1->cursor = iVar7;
                if (peVar1->size <= iVar7) {
                  std::
                  deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ::pop_back(&this_00->c);
                }
              }
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (psVar4 != psVar5) {
                psVar3 = psVar4;
                if (psVar4 == (this->input_stack).c.
                              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  psVar3 = (this->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar1 = psVar3[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar7 = peVar1->cursor;
                if (((-1 < (long)iVar7) && (iVar7 < peVar1->size)) &&
                   (peVar1->buffer[iVar7] == '\n')) break;
              }
              bVar2 = finished(this);
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            } while (!bVar2);
            if (psVar4 != psVar5) {
              this->cursor = this->cursor + 1;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar1->cursor + 1;
              peVar1->cursor = iVar7;
              if (peVar1->size <= iVar7) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
          }
        }
      }
    }
LAB_00133d83:
    bVar2 = iVar6 == this->cursor;
    iVar6 = this->cursor;
    if (bVar2) {
      return this;
    }
  } while( true );
}

Assistant:

text_input_buffer&
text_input_buffer::next_token()
{
	auto &self = *this;
	int start;
	do {
		start = cursor;
		skip_spaces();
		if (finished())
		{
			return self;
		}
		// Parse /* comments
		if (*self == '/' && peek() == '*')
		{
			// eat the start of the comment
			++self;
			++self;
			do {
				// Find the ending * of */
				while ((*self != '\0') && (*self != '*') && !finished())
				{
					++self;
				}
				// Eat the *
				++self;
			} while ((*self != '\0') && (*self != '/') && !finished());
			// Eat the /
			++self;
		}
		// Parse // comments
		if ((*self == '/' && peek() == '/'))
		{
			// eat the start of the comment
			++self;
			++self;
			// Find the ending of the line
			while (*self != '\n' && !finished())
			{
				++self;
			}
			// Eat the \n
			++self;
		}
	} while (start != cursor);
	return self;
}